

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  uint local_30;
  uint32_t byte;
  uint32_t shift;
  uint32_t result;
  uint32_t *value_local;
  char *limit_local;
  char *p_local;
  
  byte = 0;
  local_30 = 0;
  limit_local = p;
  while( true ) {
    if (0x1c < local_30 || limit <= limit_local) {
      return (char *)0x0;
    }
    bVar1 = *limit_local;
    limit_local = limit_local + 1;
    if ((bVar1 & 0x80) == 0) break;
    byte = (bVar1 & 0x7f) << ((byte)local_30 & 0x1f) | byte;
    local_30 = local_30 + 7;
  }
  *value = (uint)bVar1 << ((byte)local_30 & 0x1f) | byte;
  return limit_local;
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const unsigned char*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}